

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_stream_socket.c
# Opt level: O3

oonf_stream_session *
oonf_stream_connect_to(oonf_stream_socket *stream_socket,netaddr_socket *remote)

{
  oonf_log_source oVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int *piVar5;
  char *pcVar6;
  oonf_stream_session *poVar7;
  undefined8 uVar8;
  ulong uVar9;
  char *pcVar10;
  os_fd sock;
  netaddr remote_addr;
  netaddr_str nbuf1;
  netaddr_str nbuf2;
  
  uVar9 = (ulong)_oonf_stream_socket_subsystem.logging;
  if (((&log_global_mask)[uVar9] & 1) != 0) {
    uVar3 = netaddr_socket_to_string(&nbuf1,&stream_socket->local_socket);
    uVar4 = netaddr_socket_to_string(&nbuf2,remote);
    oonf_log(1,uVar9,"src/base/oonf_stream_socket.c",0x112,0,0,"Connect TCP socket from %s to %s",
             uVar3,uVar4);
  }
  iVar2 = os_fd_generic_getsocket
                    (&sock,&stream_socket->local_socket,true,0,(os_interface *)0x0,
                     _oonf_stream_socket_subsystem.logging);
  if (iVar2 != 0) {
    return (oonf_stream_session *)0x0;
  }
  iVar2 = connect(sock.fd,(sockaddr *)&remote->v4,0x80);
  if (iVar2 != 0) {
    piVar5 = __errno_location();
    oVar1 = _oonf_stream_socket_subsystem.logging;
    if (*piVar5 != 0x73) {
      if (*piVar5 == 0x6f) {
        if (((&log_global_mask)[_oonf_stream_socket_subsystem.logging] & 2) == 0) goto LAB_0011d010;
        uVar3 = netaddr_socket_to_string(&nbuf1,remote);
        pcVar6 = strerror(*piVar5);
        iVar2 = *piVar5;
        pcVar10 = "TCP connection to %s refused: %s (%d)";
        uVar8 = 2;
        uVar4 = 0x11c;
      }
      else {
        if (((&log_global_mask)[_oonf_stream_socket_subsystem.logging] & 4) == 0) goto LAB_0011d010;
        uVar3 = netaddr_socket_to_string(&nbuf1,remote);
        pcVar6 = strerror(*piVar5);
        iVar2 = *piVar5;
        pcVar10 = "Cannot connect outgoing tcp connection to %s: %s (%d)";
        uVar8 = 4;
        uVar4 = 0x121;
      }
      oonf_log(uVar8,oVar1,"src/base/oonf_stream_socket.c",uVar4,0,0,pcVar10,uVar3,pcVar6,iVar2);
      goto LAB_0011d010;
    }
  }
  netaddr_from_socket(&remote_addr,remote);
  poVar7 = _create_session(stream_socket,&sock,&remote_addr,remote);
  if (poVar7 != (oonf_stream_session *)0x0) {
    poVar7->wait_for_connect = iVar2 != 0;
    return poVar7;
  }
LAB_0011d010:
  iVar2 = (stream_socket->scheduler_entry).fd.fd;
  if (iVar2 != -1) {
    close(iVar2);
    (stream_socket->scheduler_entry).fd.fd = -1;
  }
  return (oonf_stream_session *)0x0;
}

Assistant:

struct oonf_stream_session *
oonf_stream_connect_to(struct oonf_stream_socket *stream_socket, const union netaddr_socket *remote) {
  struct oonf_stream_session *session;
  struct os_fd sock;
  struct netaddr remote_addr;
  bool wait_for_connect = false;
  struct netaddr_str nbuf1;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str nbuf2;
#endif

  OONF_DEBUG(LOG_STREAM, "Connect TCP socket from %s to %s",
    netaddr_socket_to_string(&nbuf1, &stream_socket->local_socket), netaddr_socket_to_string(&nbuf2, remote));

  if (os_fd_getsocket(&sock, &stream_socket->local_socket, true, 0, NULL, LOG_STREAM)) {
    return NULL;
  }

  if (os_fd_connect(&sock, remote)) {
    if (errno == ECONNREFUSED) {
      /* Don't produce a warning for an failed outgoing TCP connection */
      OONF_INFO(LOG_STREAM, "TCP connection to %s refused: %s (%d)",
        netaddr_socket_to_string(&nbuf1, remote), strerror(errno), errno);
      goto connect_to_error;
    }
    else if (errno != EINPROGRESS) {
      OONF_WARN(LOG_STREAM, "Cannot connect outgoing tcp connection to %s: %s (%d)",
        netaddr_socket_to_string(&nbuf1, remote), strerror(errno), errno);
      goto connect_to_error;
    }
    wait_for_connect = true;
  }

  netaddr_from_socket(&remote_addr, remote);
  session = _create_session(stream_socket, &sock, &remote_addr, remote);
  if (session) {
    session->wait_for_connect = wait_for_connect;
    return session;
  }

  /* fall through */
connect_to_error:
  os_fd_close(&stream_socket->scheduler_entry.fd);
  return NULL;
}